

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

vector<duckdb::LogicalType,_true> * duckdb::LogicalType::AllTypes(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_2e9;
  LogicalType local_2e8 [4];
  LogicalType local_288;
  LogicalType local_270;
  LogicalType local_258;
  LogicalType local_240;
  LogicalType local_228;
  LogicalType local_210;
  LogicalType local_1f8;
  LogicalType local_1e0;
  LogicalType local_1c8;
  LogicalType local_1b0;
  LogicalType local_198;
  LogicalType local_180;
  LogicalType local_168;
  LogicalType local_150;
  LogicalType local_138;
  LogicalType local_120;
  LogicalType local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  LogicalType local_c0;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType(local_2e8,BOOLEAN);
  LogicalType(local_2e8 + 1,TINYINT);
  LogicalType(local_2e8 + 2,SMALLINT);
  LogicalType(local_2e8 + 3,INTEGER);
  LogicalType(&local_288,BIGINT);
  LogicalType(&local_270,DATE);
  LogicalType(&local_258,TIMESTAMP);
  LogicalType(&local_240,DOUBLE);
  LogicalType(&local_228,FLOAT);
  LogicalType(&local_210,VARCHAR);
  LogicalType(&local_1f8,BLOB);
  LogicalType(&local_1e0,BIT);
  LogicalType(&local_1c8,VARINT);
  LogicalType(&local_1b0,INTERVAL);
  LogicalType(&local_198,HUGEINT);
  LogicalType(&local_180,DECIMAL);
  LogicalType(&local_168,UTINYINT);
  LogicalType(&local_150,USMALLINT);
  LogicalType(&local_138,UINTEGER);
  LogicalType(&local_120,UBIGINT);
  LogicalType(&local_108,UHUGEINT);
  LogicalType(&local_f0,TIME);
  LogicalType(&local_d8,LIST);
  LogicalType(&local_c0,STRUCT);
  LogicalType(&local_a8,TIME_TZ);
  LogicalType(&local_90,TIMESTAMP_TZ);
  LogicalType(&local_78,MAP);
  LogicalType(&local_60,UNION);
  LogicalType(&local_48,UUID);
  LogicalType(&local_30,ARRAY);
  __l._M_len = 0x1e;
  __l._M_array = local_2e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_2e9);
  lVar1 = 0x2b8;
  do {
    ~LogicalType((LogicalType *)(&local_2e8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

const vector<LogicalType> LogicalType::AllTypes() {
	vector<LogicalType> types = {
	    LogicalType::BOOLEAN,  LogicalType::TINYINT,      LogicalType::SMALLINT,  LogicalType::INTEGER,
	    LogicalType::BIGINT,   LogicalType::DATE,         LogicalType::TIMESTAMP, LogicalType::DOUBLE,
	    LogicalType::FLOAT,    LogicalType::VARCHAR,      LogicalType::BLOB,      LogicalType::BIT,
	    LogicalType::VARINT,   LogicalType::INTERVAL,     LogicalType::HUGEINT,   LogicalTypeId::DECIMAL,
	    LogicalType::UTINYINT, LogicalType::USMALLINT,    LogicalType::UINTEGER,  LogicalType::UBIGINT,
	    LogicalType::UHUGEINT, LogicalType::TIME,         LogicalTypeId::LIST,    LogicalTypeId::STRUCT,
	    LogicalType::TIME_TZ,  LogicalType::TIMESTAMP_TZ, LogicalTypeId::MAP,     LogicalTypeId::UNION,
	    LogicalType::UUID,     LogicalTypeId::ARRAY};
	return types;
}